

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O1

ssize_t __thiscall
LASreadItemCompressed_GPSTIME11_v1::read
          (LASreadItemCompressed_GPSTIME11_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  U32 UVar1;
  int iVar2;
  U64 UVar3;
  int iVar4;
  I32 pred;
  undefined4 in_register_00000034;
  IntegerCompressor *this_00;
  
  if (this->last_gpstime_diff == 0) {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_0diff);
    if (UVar1 != 2) {
      if (UVar1 != 1) goto LAB_00126fc9;
      iVar2 = IntegerCompressor::decompress(this->ic_gpstime,0,0);
      this->last_gpstime_diff = iVar2;
      goto LAB_00126fc3;
    }
  }
  else {
    UVar1 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_multi);
    if ((int)UVar1 < 0x1fe) {
      if (UVar1 == 0) {
        iVar2 = this->last_gpstime_diff;
        iVar4 = iVar2 + 3;
        if (-1 < iVar2) {
          iVar4 = iVar2;
        }
        iVar2 = IntegerCompressor::decompress(this->ic_gpstime,iVar4 >> 2,2);
LAB_00126f74:
        iVar4 = this->multi_extreme_counter;
        this->multi_extreme_counter = iVar4 + 1;
        if (2 < iVar4) {
LAB_00126f84:
          this->last_gpstime_diff = iVar2;
          this->multi_extreme_counter = 0;
        }
      }
      else {
        if (UVar1 == 1) {
          iVar2 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff,1);
          goto LAB_00126f84;
        }
        if ((int)UVar1 < 10) {
          this_00 = this->ic_gpstime;
          pred = this->last_gpstime_diff * UVar1;
          UVar1 = 3;
        }
        else {
          pred = this->last_gpstime_diff * UVar1;
          this_00 = this->ic_gpstime;
          if (0x31 < (int)UVar1) {
            iVar2 = IntegerCompressor::decompress(this_00,pred,5);
            if (UVar1 != 0x1fd) goto LAB_00126fc3;
            goto LAB_00126f74;
          }
          UVar1 = 4;
        }
        iVar2 = IntegerCompressor::decompress(this_00,pred,UVar1);
      }
LAB_00126fc3:
      (this->last_gpstime).u64 = (this->last_gpstime).u64 + (long)iVar2;
      goto LAB_00126fc9;
    }
    if (UVar1 != 0x1fe) goto LAB_00126fc9;
  }
  UVar3 = ArithmeticDecoder::readInt64(this->dec);
  (this->last_gpstime).u64 = UVar3;
LAB_00126fc9:
  UVar3 = (this->last_gpstime).u64;
  *(U64 *)CONCAT44(in_register_00000034,__fd) = UVar3;
  return UVar3;
}

Assistant:

inline void LASreadItemCompressed_GPSTIME11_v1::read(U8* item, U32& context)
{
  I32 multi;
  if (last_gpstime_diff == 0) // if the last integer difference was zero
  {
    multi = dec->decodeSymbol(m_gpstime_0diff);
    if (multi == 1) // the difference can be represented with 32 bits
    {
      last_gpstime_diff = ic_gpstime->decompress(0, 0);
      last_gpstime.i64 += last_gpstime_diff;      
    }
    else if (multi == 2) // the difference is huge
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  else
  {
    multi = dec->decodeSymbol(m_gpstime_multi);

    if (multi <  LASZIP_GPSTIME_MULTIMAX-2)
    {
      I32 gpstime_diff;
      if (multi == 1)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff, 1);
        last_gpstime_diff = gpstime_diff;
        multi_extreme_counter = 0;
      }
      else if (multi == 0)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff/4, 2);
        multi_extreme_counter++;
        if (multi_extreme_counter > 3)
        {
          last_gpstime_diff = gpstime_diff;
          multi_extreme_counter = 0;
        }
      }
      else if (multi < 10)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 3);
      }
      else if (multi < 50)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 4);
      }
      else
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 5);
        if (multi == LASZIP_GPSTIME_MULTIMAX-3)
        {
          multi_extreme_counter++;
          if (multi_extreme_counter > 3)
          {
            last_gpstime_diff = gpstime_diff;
            multi_extreme_counter = 0;
          }
        }
      }
      last_gpstime.i64 += gpstime_diff;
    }
    else if (multi <  LASZIP_GPSTIME_MULTIMAX-1)
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  *((I64*)item) = last_gpstime.i64;
}